

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

void __thiscall bal::Formula::add_named_variable(Formula *this,char *name,VariablesArray *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  allocator local_69;
  char *local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
  local_60;
  
  local_68 = name;
  std::__cxx11::string::string((string *)&local_60,name,&local_69);
  iVar2 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
          ::find(&(this->named_variables_)._M_t,&local_60.first);
  paVar1 = &local_60.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->named_variables_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
    ::pair<const_char_*const_&,_true>(&local_60,&local_68,value);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,bal::VariablesArray>,std::_Select1st<std::pair<std::__cxx11::string_const,bal::VariablesArray>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,bal::VariablesArray>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,bal::VariablesArray>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,bal::VariablesArray>,std::_Select1st<std::pair<std::__cxx11::string_const,bal::VariablesArray>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,bal::VariablesArray>>>
                *)&this->named_variables_,&local_60);
    if (local_60.second.super_Container<unsigned_int>.allocated_size_ != 0) {
      if (local_60.second.super_Container<unsigned_int>.data_ != (uint *)0x0) {
        free(local_60.second.super_Container<unsigned_int>.data_);
        local_60.second.super_Container<unsigned_int>.data_ = (uint *)0x0;
      }
      local_60.second.super_Container<unsigned_int>.allocated_size_ = 0;
    }
    local_60.second.super_Container<unsigned_int>._8_8_ =
         (ulong)local_60.second.super_Container<unsigned_int>.allocated_size_ << 0x20;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
  }
  else {
    VariablesArray::operator=((VariablesArray *)(iVar2._M_node + 2),value);
  }
  return;
}

Assistant:

void Formula::add_named_variable(const char* const name, const VariablesArray& value) {
        // a copy of value is made here; overwrites any previous value
        auto it = named_variables_.find(name);
        if (it == named_variables_.end()) {
            named_variables_.insert({name, value});
        } else {
            it->second = value;
        };
    }